

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

bool __thiscall
tinyusdz::primvar::PrimVar::
get_interpolated_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,
          vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *v)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  pointer pSVar4;
  pointer pSVar5;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> local_60;
  optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> local_48;
  
  if (v == (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
              (&local_48,this);
    bVar2 = local_48.has_value_;
    if (local_48.has_value_ != false) {
      local_60.super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_48.contained.data._0_8_;
      local_60.super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_48.contained._8_8_;
      local_60.super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48.contained._16_8_;
      std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::operator=
                (v,&local_60);
    }
    if (((bVar2 & 1U) != 0) &&
       ((anon_struct_8_0_00000001_for___align)
        local_60.super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
        ._M_impl.super__Vector_impl_data._M_start != (anon_struct_8_0_00000001_for___align)0x0)) {
      operator_delete(local_60.
                      super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar2 != false) {
      return true;
    }
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar4 == pSVar5) {
      return false;
    }
  }
  else {
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar5 != pSVar4) {
    bVar2 = tinyusdz::value::TimeSamples::
            get<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  if (((this->_blocked != false) ||
      (pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0)) ||
     ((uVar3 = (*pvVar1->type_id)(), uVar3 != 0 &&
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))) {
    get_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
              (&local_48,this);
    if (local_48.has_value_ != false) {
      local_60.super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_48.contained.data._0_8_;
      local_60.super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_48.contained._8_8_;
      local_60.super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48.contained._16_8_;
      std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::operator=
                (v,&local_60);
    }
    if (((local_48.has_value_ & 1U) != 0) &&
       ((anon_struct_8_0_00000001_for___align)
        local_60.super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
        ._M_impl.super__Vector_impl_data._M_start != (anon_struct_8_0_00000001_for___align)0x0)) {
      operator_delete(local_60.
                      super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.has_value_ != false) {
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }